

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O1

USTATUS __thiscall FfsParser::parseGuidedSectionBody(FfsParser *this,UModelIndex *index)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TreeModel *this_00;
  _Alloc_hider __n;
  UINT32 UVar2;
  bool bVar3;
  int iVar4;
  USTATUS UVar5;
  USTATUS UVar6;
  CBString *pCVar7;
  UINT8 algorithm;
  size_type __dnew;
  UINT32 dictionarySize;
  size_type __dnew_1;
  CBString info;
  UByteArray processed;
  UByteArray baGuid;
  UByteArray efiDecompressed;
  EFI_GUID guid;
  UINT8 local_119;
  UByteArray local_118;
  UINT32 local_f4;
  CBString local_f0;
  CBString local_d8;
  CBString local_c0;
  UByteArray local_a8;
  pointer *local_88;
  pointer local_80;
  pointer local_78 [2];
  UByteArray local_68;
  pointer local_48;
  pointer pcStack_40;
  
  if (index->r < 0) {
    return 1;
  }
  if (index->c < 0) {
    return 1;
  }
  if (index->m == (TreeModel *)0x0) {
    return 1;
  }
  local_48 = (pointer)0x0;
  pcStack_40 = (pointer)0x0;
  bVar3 = TreeModel::hasEmptyParsingData(this->model,index);
  if (!bVar3) {
    TreeModel::parsingData(&local_a8,this->model,index);
    local_48 = *local_a8.d._M_dataplus._M_p;
    pcStack_40 = *(pointer *)(local_a8.d._M_dataplus._M_p + 8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.d._M_dataplus._M_p != &local_a8.d.field_2) {
      operator_delete(local_a8.d._M_dataplus._M_p);
    }
  }
  TreeModel::body(&local_a8,this->model,index);
  local_68.d._M_dataplus._M_p = (pointer)&local_68.d.field_2;
  local_68.d._M_string_length = 0;
  local_68.d.field_2._M_local_buf[0] = '\0';
  Bstrlib::CBString::CBString(&local_c0);
  local_119 = '\x01';
  local_f4 = 0;
  local_88 = local_78;
  local_118.d._M_dataplus._M_p = (pointer)0x10;
  local_88 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_118);
  __n._M_p = local_118.d._M_dataplus._M_p;
  local_78[0] = local_118.d._M_dataplus._M_p;
  *local_88 = local_48;
  local_88[1] = pcStack_40;
  local_80 = local_118.d._M_dataplus._M_p;
  *((long)local_88 + local_118.d._M_dataplus._M_p) = '\0';
  if ((local_118.d._M_dataplus._M_p == (pointer)EFI_GUIDED_SECTION_TIANO.d._M_string_length) &&
     ((local_118.d._M_dataplus._M_p == (pointer)0x0 ||
      (iVar4 = bcmp(local_88,EFI_GUIDED_SECTION_TIANO.d._M_dataplus._M_p,
                    (size_t)local_118.d._M_dataplus._M_p), iVar4 == 0)))) {
    TreeModel::body(&local_118,this->model,index);
    UVar5 = decompress(&local_118,'\x01',&local_119,&local_f4,&local_a8,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.d._M_dataplus._M_p != &local_118.d.field_2) {
      operator_delete(local_118.d._M_dataplus._M_p);
    }
    if (UVar5 == 0) {
      bVar3 = true;
      if (local_119 == '\x04') {
        UVar6 = parseSections(this,&local_a8,index,false);
        if (UVar6 == 0) {
          local_119 = '\x03';
        }
        else {
          UVar6 = parseSections(this,&local_68,index,false);
          if (UVar6 == 0) {
            local_119 = '\x02';
            std::__cxx11::string::_M_assign((string *)&local_a8);
          }
          else {
            usprintf((CBString *)&local_118,
                     "%s: can\'t guess the correct decompression algorithm, both preparse steps are failed"
                     ,"parseGuidedSectionBody");
            msg(this,(CBString *)&local_118,index);
            Bstrlib::CBString::~CBString((CBString *)&local_118);
            bVar3 = false;
          }
        }
      }
      Bstrlib::CBString::CBString(&local_f0,"\nCompression algorithm: ");
      compressionTypeToUString(&local_d8,local_119);
      Bstrlib::CBString::operator+((CBString *)&local_118,&local_f0,&local_d8);
      Bstrlib::CBString::operator+=(&local_c0,(CBString *)&local_118);
      Bstrlib::CBString::~CBString((CBString *)&local_118);
      Bstrlib::CBString::~CBString(&local_d8);
      Bstrlib::CBString::~CBString(&local_f0);
      usprintf((CBString *)&local_118,"\nDecompressed size: %Xh (%u)",
               (ulong)(uint)local_a8.d._M_string_length);
      Bstrlib::CBString::operator+=(&local_c0,(CBString *)&local_118);
LAB_001347e8:
      pCVar7 = (CBString *)&local_118;
LAB_001347ed:
      Bstrlib::CBString::~CBString(pCVar7);
    }
    else {
      usprintf(&local_f0,"%s: decompression failed with error ","parseGuidedSectionBody");
      errorCodeToUString(&local_d8,UVar5);
      Bstrlib::CBString::operator+((CBString *)&local_118,&local_f0,&local_d8);
      msg(this,(CBString *)&local_118,index);
LAB_001341f8:
      Bstrlib::CBString::~CBString((CBString *)&local_118);
      Bstrlib::CBString::~CBString(&local_d8);
      pCVar7 = &local_f0;
LAB_00134211:
      Bstrlib::CBString::~CBString(pCVar7);
      bVar3 = true;
    }
LAB_00134219:
    if (UVar5 == 0) {
LAB_00134222:
      TreeModel::addInfo(this->model,index,&local_c0,true);
      UVar2 = local_f4;
      this_00 = this->model;
      paVar1 = &local_118.d.field_2;
      local_f0._vptr_CBString = (_func_int **)0x14;
      local_118.d._M_dataplus._M_p = (pointer)paVar1;
      local_118.d._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_118,(ulong)&local_f0);
      local_118.d.field_2._M_allocated_capacity = (size_type)local_f0._vptr_CBString;
      local_118.d._M_dataplus._M_p[0] = '\0';
      local_118.d._M_dataplus._M_p[1] = '\0';
      local_118.d._M_dataplus._M_p[2] = '\0';
      local_118.d._M_dataplus._M_p[3] = '\0';
      local_118.d._M_dataplus._M_p[4] = '\0';
      local_118.d._M_dataplus._M_p[5] = '\0';
      local_118.d._M_dataplus._M_p[6] = '\0';
      local_118.d._M_dataplus._M_p[7] = '\0';
      local_118.d._M_dataplus._M_p[8] = '\0';
      local_118.d._M_dataplus._M_p[9] = '\0';
      local_118.d._M_dataplus._M_p[10] = '\0';
      local_118.d._M_dataplus._M_p[0xb] = '\0';
      local_118.d._M_dataplus._M_p[0xc] = '\0';
      local_118.d._M_dataplus._M_p[0xd] = '\0';
      local_118.d._M_dataplus._M_p[0xe] = '\0';
      local_118.d._M_dataplus._M_p[0xf] = '\0';
      *(UINT32 *)(local_118.d._M_dataplus._M_p + 0x10) = UVar2;
      local_118.d._M_string_length = (size_type)local_f0._vptr_CBString;
      local_118.d._M_dataplus._M_p[(long)local_f0._vptr_CBString] = '\0';
      TreeModel::setParsingData(this_00,index,&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.d._M_dataplus._M_p != paVar1) {
        operator_delete(local_118.d._M_dataplus._M_p);
      }
      if (local_119 != '\x01') {
        TreeModel::setUncompressedData(this->model,index,&local_a8);
        TreeModel::setCompressed(this->model,index,true);
      }
      if (bVar3) {
        UVar5 = parseSections(this,&local_a8,index,true);
        goto LAB_00134333;
      }
      usprintf((CBString *)&local_118,"%s: GUID defined section can not be processed",
               "parseGuidedSectionBody");
      msg(this,(CBString *)&local_118,index);
      Bstrlib::CBString::~CBString((CBString *)&local_118);
    }
  }
  else {
    if ((((__n._M_p == (pointer)EFI_GUIDED_SECTION_LZMA.d._M_string_length) &&
         ((__n._M_p == (pointer)0x0 ||
          (iVar4 = bcmp(local_88,EFI_GUIDED_SECTION_LZMA.d._M_dataplus._M_p,(size_t)__n._M_p),
          iVar4 == 0)))) ||
        ((__n._M_p == (pointer)EFI_GUIDED_SECTION_LZMA_HP.d._M_string_length &&
         ((__n._M_p == (pointer)0x0 ||
          (iVar4 = bcmp(local_88,EFI_GUIDED_SECTION_LZMA_HP.d._M_dataplus._M_p,(size_t)__n._M_p),
          iVar4 == 0)))))) ||
       ((__n._M_p == (pointer)EFI_GUIDED_SECTION_LZMA_MS.d._M_string_length &&
        ((__n._M_p == (pointer)0x0 ||
         (iVar4 = bcmp(local_88,EFI_GUIDED_SECTION_LZMA_MS.d._M_dataplus._M_p,(size_t)__n._M_p),
         iVar4 == 0)))))) {
      TreeModel::body(&local_118,this->model,index);
      UVar5 = decompress(&local_118,'\x02',&local_119,&local_f4,&local_a8,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.d._M_dataplus._M_p != &local_118.d.field_2) {
        operator_delete(local_118.d._M_dataplus._M_p);
      }
      if (UVar5 != 0) {
        usprintf(&local_f0,"%s: decompression failed with error ","parseGuidedSectionBody");
        errorCodeToUString(&local_d8,UVar5);
        Bstrlib::CBString::operator+((CBString *)&local_118,&local_f0,&local_d8);
        msg(this,(CBString *)&local_118,index);
        goto LAB_001341f8;
      }
      if (local_119 == '\x05') {
        Bstrlib::CBString::CBString((CBString *)&local_118,"\nCompression algorithm: LZMA");
        Bstrlib::CBString::operator+=(&local_c0,(CBString *)&local_118);
        Bstrlib::CBString::~CBString((CBString *)&local_118);
        usprintf((CBString *)&local_118,"\nDecompressed size: %Xh (%u)",
                 (ulong)(uint)local_a8.d._M_string_length);
        Bstrlib::CBString::operator+=(&local_c0,(CBString *)&local_118);
        Bstrlib::CBString::~CBString((CBString *)&local_118);
        usprintf((CBString *)&local_118,"\nLZMA dictionary size: %Xh",(ulong)local_f4);
        Bstrlib::CBString::operator+=(&local_c0,(CBString *)&local_118);
        goto LAB_0013441c;
      }
      Bstrlib::CBString::CBString((CBString *)&local_118,"\nCompression algorithm: unknown");
      Bstrlib::CBString::operator+=(&local_c0,(CBString *)&local_118);
LAB_001344cb:
      Bstrlib::CBString::~CBString((CBString *)&local_118);
      bVar3 = false;
      goto LAB_00134219;
    }
    if ((__n._M_p == (pointer)EFI_GUIDED_SECTION_LZMAF86.d._M_string_length) &&
       ((__n._M_p == (pointer)0x0 ||
        (iVar4 = bcmp(local_88,EFI_GUIDED_SECTION_LZMAF86.d._M_dataplus._M_p,(size_t)__n._M_p),
        iVar4 == 0)))) {
      TreeModel::body(&local_118,this->model,index);
      UVar5 = decompress(&local_118,0x86,&local_119,&local_f4,&local_a8,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.d._M_dataplus._M_p != &local_118.d.field_2) {
        operator_delete(local_118.d._M_dataplus._M_p);
      }
      if (UVar5 != 0) {
        usprintf(&local_f0,"%s: decompression failed with error ","parseGuidedSectionBody");
        errorCodeToUString(&local_d8,UVar5);
        Bstrlib::CBString::operator+((CBString *)&local_118,&local_f0,&local_d8);
        msg(this,(CBString *)&local_118,index);
        goto LAB_001341f8;
      }
      if (local_119 != '\a') {
        Bstrlib::CBString::CBString((CBString *)&local_118,"\nCompression algorithm: unknown");
        Bstrlib::CBString::operator+=(&local_c0,(CBString *)&local_118);
        goto LAB_001344cb;
      }
      Bstrlib::CBString::CBString((CBString *)&local_118,"\nCompression algorithm: LZMAF86");
      Bstrlib::CBString::operator+=(&local_c0,(CBString *)&local_118);
      Bstrlib::CBString::~CBString((CBString *)&local_118);
      usprintf((CBString *)&local_118,"\nDecompressed size: %Xh (%u)",
               (ulong)(uint)local_a8.d._M_string_length);
      Bstrlib::CBString::operator+=(&local_c0,(CBString *)&local_118);
      Bstrlib::CBString::~CBString((CBString *)&local_118);
      usprintf((CBString *)&local_118,"\nLZMA dictionary size: %Xh",(ulong)local_f4);
      Bstrlib::CBString::operator+=(&local_c0,(CBString *)&local_118);
LAB_0013441c:
      pCVar7 = (CBString *)&local_118;
      goto LAB_00134211;
    }
    if ((__n._M_p != (pointer)EFI_GUIDED_SECTION_GZIP.d._M_string_length) ||
       ((__n._M_p != (pointer)0x0 &&
        (iVar4 = bcmp(local_88,EFI_GUIDED_SECTION_GZIP.d._M_dataplus._M_p,(size_t)__n._M_p),
        iVar4 != 0)))) {
      bVar3 = true;
      if ((__n._M_p == (pointer)EFI_GUIDED_SECTION_ZLIB_AMD.d._M_string_length) &&
         ((__n._M_p == (pointer)0x0 ||
          (iVar4 = bcmp(local_88,EFI_GUIDED_SECTION_ZLIB_AMD.d._M_dataplus._M_p,(size_t)__n._M_p),
          iVar4 == 0)))) {
        TreeModel::body(&local_118,this->model,index);
        UVar5 = zlibDecompress(&local_118,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118.d._M_dataplus._M_p != &local_118.d.field_2) {
          operator_delete(local_118.d._M_dataplus._M_p);
        }
        bVar3 = true;
        if (UVar5 == 0) {
          local_119 = '\t';
          Bstrlib::CBString::CBString((CBString *)&local_118,"\nCompression algorithm: Zlib");
          Bstrlib::CBString::operator+=(&local_c0,(CBString *)&local_118);
          Bstrlib::CBString::~CBString((CBString *)&local_118);
          usprintf((CBString *)&local_118,"\nDecompressed size: %Xh (%u)",
                   (ulong)(uint)local_a8.d._M_string_length);
          Bstrlib::CBString::operator+=(&local_c0,(CBString *)&local_118);
          goto LAB_001347e8;
        }
        usprintf(&local_f0,"%s: decompression failed with error ","parseGuidedSectionBody");
        errorCodeToUString(&local_d8,UVar5);
        Bstrlib::CBString::operator+((CBString *)&local_118,&local_f0,&local_d8);
        msg(this,(CBString *)&local_118,index);
        Bstrlib::CBString::~CBString((CBString *)&local_118);
        Bstrlib::CBString::~CBString(&local_d8);
        pCVar7 = &local_f0;
        goto LAB_001347ed;
      }
      goto LAB_00134222;
    }
    TreeModel::body(&local_118,this->model,index);
    UVar5 = gzipDecompress(&local_118,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.d._M_dataplus._M_p != &local_118.d.field_2) {
      operator_delete(local_118.d._M_dataplus._M_p);
    }
    if (UVar5 == 0) {
      local_119 = '\b';
      Bstrlib::CBString::CBString((CBString *)&local_118,"\nCompression algorithm: GZip");
      Bstrlib::CBString::operator+=(&local_c0,(CBString *)&local_118);
      Bstrlib::CBString::~CBString((CBString *)&local_118);
      usprintf((CBString *)&local_118,"\nDecompressed size: %Xh (%u)",
               (ulong)(uint)local_a8.d._M_string_length);
      Bstrlib::CBString::operator+=(&local_c0,(CBString *)&local_118);
      pCVar7 = (CBString *)&local_118;
    }
    else {
      usprintf(&local_f0,"%s: decompression failed with error ","parseGuidedSectionBody");
      errorCodeToUString(&local_d8,UVar5);
      Bstrlib::CBString::operator+((CBString *)&local_118,&local_f0,&local_d8);
      msg(this,(CBString *)&local_118,index);
      Bstrlib::CBString::~CBString((CBString *)&local_118);
      Bstrlib::CBString::~CBString(&local_d8);
      pCVar7 = &local_f0;
    }
    Bstrlib::CBString::~CBString(pCVar7);
    if (UVar5 == 0) {
      bVar3 = true;
      goto LAB_00134222;
    }
  }
  UVar5 = 0;
LAB_00134333:
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  Bstrlib::CBString::~CBString(&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.d._M_dataplus._M_p != &local_68.d.field_2) {
    operator_delete(local_68.d._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.d._M_dataplus._M_p != &local_a8.d.field_2) {
    operator_delete(local_a8.d._M_dataplus._M_p);
  }
  return UVar5;
}

Assistant:

std::vector<std::pair<std::vector<UString>, UModelIndex> > FfsParser::getFitTable() const
{
    return fitParser->getFitTable();
}